

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

UText * utext_openConstUnicodeString_63(UText *ut,UnicodeString *s,UErrorCode *status)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  UChar *pUVar4;
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     ((undefined1  [56])((undefined1  [56])s->fUnion & (undefined1  [56])0x1) !=
      (undefined1  [56])0x0)) {
    utext_openUChars_63(ut,(UChar *)0x0,0,status);
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    ut = utext_setup_63(ut,0,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      ut->pFuncs = &unistrFuncs;
      ut->context = s;
      ut->providerProperties = 4;
      uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
      if ((uVar1 & 0x11) == 0) {
        if ((uVar1 & 2) == 0) {
          pUVar4 = (s->fUnion).fFields.fArray;
        }
        else {
          pUVar4 = (UChar *)((long)&s->fUnion + 2);
        }
      }
      else {
        pUVar4 = (UChar *)0x0;
      }
      ut->chunkContents = pUVar4;
      sVar2 = (s->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar3 = (s->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar2 >> 5;
      }
      ut->chunkLength = iVar3;
      ut->chunkNativeStart = 0;
      ut->chunkNativeLimit = (long)iVar3;
      ut->nativeIndexingLimit = iVar3;
    }
  }
  return ut;
}

Assistant:

U_CAPI UText * U_EXPORT2
utext_openConstUnicodeString(UText *ut, const UnicodeString *s, UErrorCode *status) {
    if (U_SUCCESS(*status) && s->isBogus()) {
        // The UnicodeString is bogus, but we still need to detach the UText
        //   from whatever it was hooked to before, if anything.
        utext_openUChars(ut, NULL, 0, status);
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return ut;
    }
    ut = utext_setup(ut, 0, status);
    //    note:  use the standard (writable) function table for UnicodeString.
    //           The flag settings disable writing, so having the functions in
    //           the table is harmless.
    if (U_SUCCESS(*status)) {
        ut->pFuncs              = &unistrFuncs;
        ut->context             = s;
        ut->providerProperties  = I32_FLAG(UTEXT_PROVIDER_STABLE_CHUNKS);
        ut->chunkContents       = s->getBuffer();
        ut->chunkLength         = s->length();
        ut->chunkNativeStart    = 0;
        ut->chunkNativeLimit    = ut->chunkLength;
        ut->nativeIndexingLimit = ut->chunkLength;
    }
    return ut;
}